

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O1

maybe<pstore::repo::visibility,_void> __thiscall
pstore::exchange::import_ns::definition::decode_visibility(definition *this,string *visibility)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)visibility);
  if (iVar1 == 0) {
    *(undefined2 *)&(this->super_rule)._vptr_rule = 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)visibility);
    if (iVar1 == 0) {
      *(undefined2 *)&(this->super_rule)._vptr_rule = 0x101;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)visibility);
      if (iVar1 == 0) {
        *(undefined2 *)&(this->super_rule)._vptr_rule = 0x201;
      }
      else {
        *(undefined2 *)&(this->super_rule)._vptr_rule = 0;
        *(undefined1 *)&(this->super_rule)._vptr_rule = 0;
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

maybe<repo::visibility> definition::decode_visibility (std::string const & visibility) {
                if (visibility == "default") {
                    return just (repo::visibility::default_vis);
                }
                if (visibility == "hidden") {
                    return just (repo::visibility::hidden_vis);
                }
                if (visibility == "protected") {
                    return just (repo::visibility::protected_vis);
                }
                return nothing<repo::visibility> ();
            }